

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *p_work,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *vec)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  cpp_dec_float<50U,_int,_void> *pcVar4;
  long lVar5;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar6;
  long lVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_b8;
  cpp_dec_float<50U,_int,_void> local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  long local_38;
  
  if (0 < this->thedim) {
    local_38 = 0;
    local_40 = p_work;
    do {
      iVar3 = (this->col).orig[local_38];
      iVar2 = (this->row).orig[local_38];
      local_b8.data._M_elems._32_8_ = *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 8);
      local_b8.data._M_elems._0_8_ = *(undefined8 *)vec[iVar3].m_backend.data._M_elems;
      local_b8.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 2);
      puVar1 = vec[iVar3].m_backend.data._M_elems + 4;
      local_b8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_b8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_b8.exp = vec[iVar3].m_backend.exp;
      local_b8.neg = vec[iVar3].m_backend.neg;
      local_b8.fpclass = vec[iVar3].m_backend.fpclass;
      local_b8.prec_elem = vec[iVar3].m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)(vec + iVar3),0.0);
      if (local_b8.fpclass == cpp_dec_float_NaN) {
LAB_00290ca5:
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_b8,
                   &(this->diag).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend);
        *(undefined8 *)local_40[iVar2].m_backend.data._M_elems = local_b8.data._M_elems._0_8_;
        *(undefined8 *)(local_40[iVar2].m_backend.data._M_elems + 2) = local_b8.data._M_elems._8_8_;
        puVar1 = local_40[iVar2].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar1 = local_b8.data._M_elems._16_8_;
        *(undefined8 *)(puVar1 + 2) = local_b8.data._M_elems._24_8_;
        *(undefined8 *)(local_40[iVar2].m_backend.data._M_elems + 8) = local_b8.data._M_elems._32_8_
        ;
        local_40[iVar2].m_backend.exp = local_b8.exp;
        local_40[iVar2].m_backend.neg = local_b8.neg;
        local_40[iVar2].m_backend.fpclass = local_b8.fpclass;
        local_40[iVar2].m_backend.prec_elem = local_b8.prec_elem;
        lVar7 = (long)(this->u).row.len[iVar2];
        if (0 < lVar7) {
          lVar5 = (long)(this->u).row.start[iVar2];
          lVar7 = lVar7 + lVar5;
          lVar6 = lVar5 * 0x38;
          do {
            pcVar4 = (cpp_dec_float<50U,_int,_void> *)
                     ((long)(((this->u).row.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar6);
            local_78.fpclass = cpp_dec_float_finite;
            local_78.prec_elem = 10;
            local_78.data._M_elems[0] = 0;
            local_78.data._M_elems[1] = 0;
            local_78.data._M_elems[2] = 0;
            local_78.data._M_elems[3] = 0;
            local_78.data._M_elems[4] = 0;
            local_78.data._M_elems[5] = 0;
            local_78.data._M_elems._24_5_ = 0;
            local_78.data._M_elems[7]._1_3_ = 0;
            local_78.data._M_elems._32_5_ = 0;
            local_78.data._M_elems[9]._1_3_ = 0;
            local_78.exp = 0;
            local_78.neg = false;
            v = &local_b8;
            if (pcVar4 != &local_78) {
              local_78.data._M_elems._32_5_ = local_b8.data._M_elems._32_5_;
              local_78.data._M_elems[9]._1_3_ = local_b8.data._M_elems[9]._1_3_;
              local_78.data._M_elems[4] = local_b8.data._M_elems[4];
              local_78.data._M_elems[5] = local_b8.data._M_elems[5];
              local_78.data._M_elems._24_5_ = local_b8.data._M_elems._24_5_;
              local_78.data._M_elems[7]._1_3_ = local_b8.data._M_elems[7]._1_3_;
              local_78.data._M_elems[0] = local_b8.data._M_elems[0];
              local_78.data._M_elems[1] = local_b8.data._M_elems[1];
              local_78.data._M_elems[2] = local_b8.data._M_elems[2];
              local_78.data._M_elems[3] = local_b8.data._M_elems[3];
              local_78.exp = local_b8.exp;
              local_78.neg = local_b8.neg;
              local_78.fpclass = local_b8.fpclass;
              local_78.prec_elem = local_b8.prec_elem;
              v = pcVar4;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_78,v);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&vec[(this->u).row.idx[lVar5]].m_backend,&local_78);
            lVar5 = lVar5 + 1;
            lVar6 = lVar6 + 0x38;
          } while (lVar5 < lVar7);
        }
      }
      else {
        local_78.fpclass = cpp_dec_float_finite;
        local_78.prec_elem = 10;
        local_78.data._M_elems[0] = 0;
        local_78.data._M_elems[1] = 0;
        local_78.data._M_elems[2] = 0;
        local_78.data._M_elems[3] = 0;
        local_78.data._M_elems[4] = 0;
        local_78.data._M_elems[5] = 0;
        local_78.data._M_elems._24_5_ = 0;
        local_78.data._M_elems[7]._1_3_ = 0;
        local_78.data._M_elems._32_5_ = 0;
        local_78.data._M_elems[9]._1_3_ = 0;
        local_78.exp = 0;
        local_78.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_78,0.0);
        iVar3 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_b8,&local_78);
        if (iVar3 != 0) goto LAB_00290ca5;
      }
      local_38 = local_38 + 1;
    } while (local_38 < this->thedim);
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUleft(R* p_work, R* vec)
{
   for(int i = 0; i < thedim; ++i)
   {
      int  c  = col.orig[i];
      int  r  = row.orig[i];

      assert(c >= 0);    // Inna/Tobi: otherwise, vec[c] would be strange...
      assert(r >= 0);    // Inna/Tobi: otherwise, diag[r] would be strange...

      R x  = vec[c];


      vec[c]  = 0.0;

      if(x != 0.0)
      {
         SOPLEX_DEBUG_CHECK_HUGE_VALUE("WSOLVE01", x);
         SOPLEX_DEBUG_CHECK_HUGE_VALUE("WSOLVE02", diag[r]);

         x        *= diag[r];
         p_work[r] = x;

         int end = u.row.start[r] + u.row.len[r];

         for(int m = u.row.start[r]; m < end; m++)
         {
            vec[u.row.idx[m]] -= x * u.row.val[m];
            SOPLEX_DEBUG_CHECK_HUGE_VALUE("WSOLVE03", vec[u.row.idx[m]]);
         }
      }
   }
}